

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qo_manager.cc
# Opt level: O0

RC __thiscall
QO_Manager::ConvertBitmapToVec
          (QO_Manager *this,int bitmap,vector<int,_std::allocator<int>_> *relsInJoin)

{
  uint local_24;
  vector<int,_std::allocator<int>_> *pvStack_20;
  int i;
  vector<int,_std::allocator<int>_> *relsInJoin_local;
  QO_Manager *pQStack_10;
  int bitmap_local;
  QO_Manager *this_local;
  
  pvStack_20 = relsInJoin;
  relsInJoin_local._4_4_ = bitmap;
  pQStack_10 = this;
  for (local_24 = 0; local_24 < 0x20; local_24 = local_24 + 1) {
    if ((relsInJoin_local._4_4_ & 1 << ((byte)local_24 & 0x1f)) != 0) {
      std::vector<int,_std::allocator<int>_>::push_back
                (pvStack_20,(value_type_conflict1 *)&local_24);
    }
  }
  return 0;
}

Assistant:

RC QO_Manager::ConvertBitmapToVec(int bitmap, vector<int> &relsInJoin){
  for(int i = 0; i < 8*sizeof(int); i++){
    if((bitmap &(1 << i)))
      relsInJoin.push_back(i);
  }
  return (0);
}